

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O1

void helicsFederateRegisterInterfaces(HelicsFederate fed,char *file,HelicsError *err)

{
  Federate *pFVar1;
  size_t sVar2;
  long *local_40 [2];
  long local_30 [2];
  
  pFVar1 = getFed(fed,err);
  if (pFVar1 != (Federate *)0x0) {
    if (file == (char *)0x0) {
      if (err != (HelicsError *)0x0) {
        err->error_code = -4;
        err->message = "Invalid File specification";
      }
    }
    else {
      local_40[0] = local_30;
      sVar2 = strlen(file);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_40,file,file + sVar2);
      (*pFVar1->_vptr_Federate[0xf])(pFVar1,local_40);
      if (local_40[0] != local_30) {
        operator_delete(local_40[0],local_30[0] + 1);
      }
    }
  }
  return;
}

Assistant:

void helicsFederateRegisterInterfaces(HelicsFederate fed, const char* file, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return;
    }
    if (file == nullptr) {
        assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidFile);
        return;
    }
    try {
        fedObj->registerInterfaces(file);
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}